

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O0

int __thiscall QGenericItemModel::rowCount(QGenericItemModel *this,QModelIndex *parent)

{
  int iVar1;
  QModelIndex *in_RDI;
  ConstOp unaff_retaddr;
  
  std::unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter>::operator->
            ((unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter> *)0x84f7a0);
  iVar1 = QGenericItemModelImplBase::callConst<int,QModelIndex>
                    ((QGenericItemModelImplBase *)parent,unaff_retaddr,in_RDI);
  return iVar1;
}

Assistant:

int QGenericItemModel::rowCount(const QModelIndex &parent) const
{
    return impl->callConst<int>(QGenericItemModelImplBase::RowCount, parent);
}